

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

OutputDeclaration * __thiscall
soul::ModuleCloner::getRemappedOutput(ModuleCloner *this,OutputDeclaration *old)

{
  mapped_type *this_00;
  OutputDeclaration *pOVar1;
  key_type local_8;
  
  local_8.object = old;
  this_00 = std::__detail::
            _Map_base<soul::pool_ref<const_soul::heart::OutputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::OutputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::OutputDeclaration>,_soul::pool_ptr<soul::heart::OutputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::OutputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->outputMappings,&local_8);
  pOVar1 = pool_ptr<soul::heart::OutputDeclaration>::operator*(this_00);
  return pOVar1;
}

Assistant:

heart::OutputDeclaration& getRemappedOutput (heart::OutputDeclaration& old) { return *outputMappings[old]; }